

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap.cpp
# Opt level: O2

bool Omega_h::swap_edges(Mesh *mesh,AdaptOpts *opts)

{
  bool bVar1;
  Int IVar2;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_swap.cpp"
             ,&local_91);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x2e);
  std::operator+(&local_30,&local_50,&local_90);
  begin_code("swap_edges",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  IVar2 = Mesh::dim(mesh);
  if (IVar2 == 3) {
    bVar1 = swap_edges_3d(mesh,opts);
  }
  else {
    IVar2 = Mesh::dim(mesh);
    if (IVar2 == 2) {
      bVar1 = swap_edges_2d(mesh,opts);
    }
    else {
      bVar1 = false;
    }
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return bVar1;
}

Assistant:

bool swap_edges(Mesh* mesh, AdaptOpts const& opts) {
  OMEGA_H_TIME_FUNCTION;
  bool ret = false;
  if (mesh->dim() == 3)
    ret = swap_edges_3d(mesh, opts);
  else if (mesh->dim() == 2)
    ret = swap_edges_2d(mesh, opts);
  return ret;
}